

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLNode * __thiscall tinyxml2::XMLNode::InsertFirstChild(XMLNode *this,XMLNode *addThis)

{
  XMLNode *pXVar1;
  
  if (addThis->_document == this->_document) {
    InsertChildPreamble(this,addThis);
    pXVar1 = this->_firstChild;
    if (pXVar1 == (XMLNode *)0x0) {
      this->_lastChild = addThis;
      this->_firstChild = addThis;
      addThis->_prev = (XMLNode *)0x0;
      addThis->_next = (XMLNode *)0x0;
    }
    else {
      pXVar1->_prev = addThis;
      addThis->_next = pXVar1;
      this->_firstChild = addThis;
      addThis->_prev = (XMLNode *)0x0;
    }
    addThis->_parent = this;
  }
  else {
    addThis = (XMLNode *)0x0;
  }
  return addThis;
}

Assistant:

XMLNode* XMLNode::InsertFirstChild(XMLNode* addThis)
{
    TIXMLASSERT(addThis);
    if (addThis->_document != _document) {
        TIXMLASSERT(false);
        return 0;
    }
    InsertChildPreamble(addThis);

    if (_firstChild) {
        TIXMLASSERT(_lastChild);
        TIXMLASSERT(_firstChild->_prev == 0);

        _firstChild->_prev = addThis;
        addThis->_next = _firstChild;
        _firstChild = addThis;

        addThis->_prev = 0;
    } else {
        TIXMLASSERT(_lastChild == 0);
        _firstChild = _lastChild = addThis;

        addThis->_prev = 0;
        addThis->_next = 0;
    }
    addThis->_parent = this;
    return addThis;
}